

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugAranges.cpp
# Opt level: O1

void __thiscall
llvm::DWARFDebugAranges::extract(DWARFDebugAranges *this,DataExtractor DebugArangesData)

{
  pointer pDVar1;
  bool bVar2;
  Descriptor *Desc;
  pointer pDVar3;
  pair<llvm::DenseMapIterator<unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>,_false>,_bool>
  local_90;
  undefined1 local_78 [8];
  DWARFDebugArangeSet Set;
  uint64_t Offset;
  uint64_t CUOffset;
  DenseSetEmpty Empty;
  
  if (DebugArangesData.Data.Length != 0) {
    Set.ArangeDescriptors.
    super__Vector_base<llvm::DWARFDebugArangeSet::Descriptor,_std::allocator<llvm::DWARFDebugArangeSet::Descriptor>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    DWARFDebugArangeSet::DWARFDebugArangeSet((DWARFDebugArangeSet *)local_78);
    while( true ) {
      bVar2 = DWARFDebugArangeSet::extract
                        ((DWARFDebugArangeSet *)local_78,DebugArangesData,
                         (uint64_t *)
                         &Set.ArangeDescriptors.
                          super__Vector_base<llvm::DWARFDebugArangeSet::Descriptor,_std::allocator<llvm::DWARFDebugArangeSet::Descriptor>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pDVar1 = Set.ArangeDescriptors.
               super__Vector_base<llvm::DWARFDebugArangeSet::Descriptor,_std::allocator<llvm::DWARFDebugArangeSet::Descriptor>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (!bVar2) break;
      Offset = (uint64_t)Set.Offset._4_4_;
      for (pDVar3 = (pointer)Set._16_8_; pDVar3 != pDVar1; pDVar3 = pDVar3 + 1) {
        appendRange(this,Offset,pDVar3->Address,pDVar3->Length + pDVar3->Address);
      }
      DenseMapBase<llvm::DenseMap<unsigned_long,llvm::detail::DenseSetEmpty,llvm::DenseMapInfo<unsigned_long>,llvm::detail::DenseSetPair<unsigned_long>>,unsigned_long,llvm::detail::DenseSetEmpty,llvm::DenseMapInfo<unsigned_long>,llvm::detail::DenseSetPair<unsigned_long>>
      ::try_emplace<llvm::detail::DenseSetEmpty&>
                (&local_90,&this->ParsedCUOffsets,&Offset,(DenseSetEmpty *)((long)&CUOffset + 7));
    }
    if (Set._16_8_ != 0) {
      operator_delete((void *)Set._16_8_,
                      (long)Set.ArangeDescriptors.
                            super__Vector_base<llvm::DWARFDebugArangeSet::Descriptor,_std::allocator<llvm::DWARFDebugArangeSet::Descriptor>_>
                            ._M_impl.super__Vector_impl_data._M_finish - Set._16_8_);
    }
  }
  return;
}

Assistant:

void DWARFDebugAranges::extract(DataExtractor DebugArangesData) {
  if (!DebugArangesData.isValidOffset(0))
    return;
  uint64_t Offset = 0;
  DWARFDebugArangeSet Set;

  while (Set.extract(DebugArangesData, &Offset)) {
    uint64_t CUOffset = Set.getCompileUnitDIEOffset();
    for (const auto &Desc : Set.descriptors()) {
      uint64_t LowPC = Desc.Address;
      uint64_t HighPC = Desc.getEndAddress();
      appendRange(CUOffset, LowPC, HighPC);
    }
    ParsedCUOffsets.insert(CUOffset);
  }
}